

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::tracker_alert::tracker_alert(tracker_alert *this,tracker_alert *param_1)

{
  tracker_alert *param_1_local;
  tracker_alert *this_local;
  
  torrent_alert::torrent_alert(&this->super_torrent_alert,&param_1->super_torrent_alert);
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__tracker_alert_00b888f0;
  libtorrent::aux::noexcept_movable<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>::
  noexcept_movable((noexcept_movable<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_> *)
                   &(this->super_torrent_alert).field_0x2c,
                   (noexcept_movable<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_> *)
                   &(param_1->super_torrent_alert).field_0x2c);
  (this->m_url_idx).m_idx = (param_1->m_url_idx).m_idx;
  this->version = param_1->version;
  return;
}

Assistant:

struct TORRENT_EXPORT tracker_alert : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT tracker_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, tcp::endpoint const& ep, protocol_version v, string_view u);

#if TORRENT_ABI_VERSION == 1
		TORRENT_DEPRECATED static int const alert_type = 2;
#endif

		std::string message() const override;

		// endpoint of the listen interface being announced
		aux::noexcept_movable<tcp::endpoint> local_endpoint;

		// returns a 0-terminated string of the tracker's URL
		char const* tracker_url() const;

	private:
		aux::allocation_slot m_url_idx;
	public:
		// the bittorrent protocol version that was announced
		protocol_version version;
#if TORRENT_ABI_VERSION == 1
		// The tracker URL
		TORRENT_DEPRECATED std::string url;
#endif
	}